

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

BasicStringView<char> *
Corrade::Containers::
arrayAppend<Corrade::Containers::BasicStringView<char>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char>>,Corrade::Containers::BasicStringView<char>>
          (Array<Corrade::Containers::BasicStringView<char>,_void_(*)(Corrade::Containers::BasicStringView<char>_*,_unsigned_long)>
           *array,type *param_2)

{
  BasicStringView<char> *value;
  BasicStringView<char> *first;
  BasicStringView<char> *it;
  BasicStringView<char> *args_local;
  Array<Corrade::Containers::BasicStringView<char>,_void_(*)(Corrade::Containers::BasicStringView<char>_*,_unsigned_long)>
  *array_local;
  
  value = Implementation::
          arrayGrowBy<Corrade::Containers::BasicStringView<char>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char>>>
                    (array,1);
  first = Utility::forward<Corrade::Containers::BasicStringView<char>>(param_2);
  Implementation::
  construct<Corrade::Containers::BasicStringView<char>,Corrade::Containers::BasicStringView<char>>
            (value,first);
  return value;
}

Assistant:

T& arrayAppend(Array<T>& array, Corrade::InPlaceInitT, Args&&... args) {
    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, 1);
    /* No helper function as there's no way we could memcpy such a thing. */
    /* On GCC 4.8 this includes another workaround, see the 4.8-specific
       overload docs for details */
    Implementation::construct(*it, Utility::forward<Args>(args)...);
    return *it;
}